

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.h
# Opt level: O2

void __thiscall chrono::ChShaftsLoad::ChShaftsLoad(ChShaftsLoad *this,ChShaftsLoad *param_1)

{
  ChLoadCustomMultiple::ChLoadCustomMultiple
            (&this->super_ChLoadCustomMultiple,&param_1->super_ChLoadCustomMultiple);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_01170c20;
  this->torque = param_1->torque;
  return;
}

Assistant:

class ChApi ChShaftsLoad : public ChLoadCustomMultiple {
  public:
    ChShaftsLoad(std::shared_ptr<ChShaft> shaftA,  ///< shaft A
                 std::shared_ptr<ChShaft> shaftB   ///< shaft B
    );

    /// Compute the torque between the two shafts, given relative rotation and velocity.
    /// Torque is assumed applied to shaft B, and its opposite to A.
    /// Inherited classes MUST IMPLEMENT THIS.
    virtual void ComputeShaftShaftTorque(const double rel_rot, const double rel_rot_dt, double& result_torque) = 0;

    // Optional: inherited classes could implement this to avoid the
    // default numerical computation of jacobians:
    //   virtual void ComputeJacobian(...) // see ChLoad

    /// For diagnosis purposes, this can return the actual last computed value of
    /// the applied torque, assumed applied to body B
    double GetTorque() const { return torque; }

    std::shared_ptr<ChShaft> GetShaftA() const;
    std::shared_ptr<ChShaft> GetShaftB() const;

  protected:
    double torque;  ///< store computed values here

    /// Compute Q, the generalized load. It calls ComputeBodyBodyForceTorque, so in
    /// children classes you do not need to implement it.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;
}